

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode curl_multi_timeout(Curl_multi *multi,long *timeout_ms)

{
  long *timeout_ms_local;
  Curl_multi *multi_local;
  
  if ((multi == (Curl_multi *)0x0) || (multi->type != 0xbab1e)) {
    multi_local._4_4_ = CURLM_BAD_HANDLE;
  }
  else if ((multi->in_callback & 1U) == 0) {
    multi_local._4_4_ = multi_timeout(multi,timeout_ms);
  }
  else {
    multi_local._4_4_ = CURLM_RECURSIVE_API_CALL;
  }
  return multi_local._4_4_;
}

Assistant:

CURLMcode curl_multi_timeout(struct Curl_multi *multi,
                             long *timeout_ms)
{
  /* First, make some basic checks that the CURLM handle is a good handle */
  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  return multi_timeout(multi, timeout_ms);
}